

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_local_scale(REF_DBL *metric,REF_GRID ref_grid,REF_INT p_norm)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  REF_DBL *pRVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  REF_DBL det;
  double local_48;
  REF_GRID local_40;
  double local_38;
  
  pRVar2 = ref_grid->node;
  bVar9 = ref_grid->twod == 0;
  if ((!bVar9) && (iVar1 = pRVar2->max, 0 < (long)iVar1)) {
    pRVar3 = pRVar2->global;
    pRVar5 = metric + 5;
    lVar7 = 0;
    do {
      if (-1 < pRVar3[lVar7]) {
        pRVar5[-3] = 0.0;
        pRVar5[-1] = 0.0;
        *pRVar5 = 1.0;
      }
      lVar7 = lVar7 + 1;
      pRVar5 = pRVar5 + 6;
    } while (iVar1 != lVar7);
  }
  uVar4 = pRVar2->max;
  if (0 < (int)uVar4) {
    local_38 = -1.0 / (double)(int)((bVar9 | 2) + p_norm * 2);
    lVar7 = 0;
    pRVar5 = metric;
    local_40 = ref_grid;
    do {
      if (-1 < pRVar2->global[lVar7]) {
        uVar4 = ref_matrix_det_m(metric + lVar7 * 6,&local_48);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa2e,"ref_metric_local_scale",(ulong)uVar4,"det_m local hess scale");
          return uVar4;
        }
        if (0.0 < local_48) {
          lVar8 = 0;
          do {
            dVar10 = pow(local_48,local_38);
            pRVar5[lVar8] = dVar10 * pRVar5[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 6);
        }
      }
      lVar7 = lVar7 + 1;
      uVar4 = pRVar2->max;
      pRVar5 = pRVar5 + 6;
      ref_grid = local_40;
    } while (lVar7 < (int)uVar4);
  }
  if ((ref_grid->twod != 0) && (0 < (int)uVar4)) {
    pRVar3 = pRVar2->global;
    pRVar5 = metric + 5;
    uVar6 = 0;
    do {
      if (-1 < pRVar3[uVar6]) {
        pRVar5[-3] = 0.0;
        pRVar5[-1] = 0.0;
        *pRVar5 = 1.0;
      }
      uVar6 = uVar6 + 1;
      pRVar5 = pRVar5 + 6;
    } while (uVar4 != uVar6);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_local_scale(REF_DBL *metric, REF_GRID ref_grid,
                                          REF_INT p_norm) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_INT dimension;
  REF_DBL det, exponent;

  dimension = 3;
  if (ref_grid_twod(ref_grid)) {
    dimension = 2;
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  /* local scaling */
  exponent = -1.0 / ((REF_DBL)(2 * p_norm + dimension));
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_det_m(&(metric[6 * node]), &det), "det_m local hess scale");
    if (det > 0.0) {
      for (i = 0; i < 6; i++) metric[i + 6 * node] *= pow(det, exponent);
    }
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}